

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loadednormalizer2impl.cpp
# Opt level: O3

UNormalizationCheckResult unorm_getQuickCheck_63(UChar32 c,UNormalizationMode mode)

{
  UNormalizationCheckResult UVar1;
  Normalizer2 *pNVar2;
  UErrorCode errorCode;
  undefined8 uStack_18;
  
  UVar1 = UNORM_YES;
  if (0xfffffffb < mode - UNORM_FCD) {
    uStack_18 = 1;
    pNVar2 = icu_63::Normalizer2Factory::getInstance(mode,(UErrorCode *)((long)&uStack_18 + 4));
    UVar1 = UNORM_MAYBE;
    if (uStack_18._4_4_ < 1) {
      UVar1 = (*(pNVar2->super_UObject)._vptr_UObject[0x15])(pNVar2,c);
    }
  }
  return UVar1;
}

Assistant:

U_CFUNC UNormalizationCheckResult
unorm_getQuickCheck(UChar32 c, UNormalizationMode mode) {
    if(mode<=UNORM_NONE || UNORM_FCD<=mode) {
        return UNORM_YES;
    }
    UErrorCode errorCode=U_ZERO_ERROR;
    const Normalizer2 *norm2=Normalizer2Factory::getInstance(mode, errorCode);
    if(U_SUCCESS(errorCode)) {
        return ((const Normalizer2WithImpl *)norm2)->getQuickCheck(c);
    } else {
        return UNORM_MAYBE;
    }
}